

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

match_t * clipp::detail::prefix_match<clipp::detail::select_flags>
                    (match_t *__return_storage_ptr__,scoped_dfs_traverser *pos,arg_string *arg,
                    select_flags *select)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *this;
  arg_string *this_00;
  subrange sVar2;
  arg_string local_1a0;
  arg_string local_180;
  scoped_dfs_traverser local_160;
  scoped_dfs_traverser local_c0;
  
  do {
    pcVar1 = (pos->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pos->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start == pcVar1) {
      memset(__return_storage_ptr__,0,0xc0);
      match_t::match_t(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this = pcVar1[-1].cur._M_current;
    if ((this->type_ == param) &&
       ((this->m_).param.flags_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_).param.flags_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      sVar2 = parameter::match((parameter *)this,arg);
      if (sVar2.at_ == 0) {
        if (sVar2.length_ == arg->_M_string_length) {
          std::__cxx11::string::string((string *)&local_180,(string *)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_c0,pos);
          match_t::match_t(__return_storage_ptr__,&local_180,&local_c0);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_c0);
          this_00 = &local_180;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_1a0,(ulong)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_160,pos);
          match_t::match_t(__return_storage_ptr__,&local_1a0,&local_160);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_160);
          this_00 = &local_1a0;
        }
        std::__cxx11::string::~string((string *)this_00);
        return __return_storage_ptr__;
      }
    }
    scoped_dfs_traverser::operator++(pos);
  } while( true );
}

Assistant:

match_t
prefix_match(scoped_dfs_traverser pos, const arg_string& arg,
             const ParamSelector& select)
{
    while(pos) {
        if(pos->is_param()) {
            const auto& param = pos->as_param();
            if(select(param)) {
                const auto match = param.match(arg);
                if(match.prefix()) {
                    if(match.length() == arg.size()) {
                        return match_t{arg, std::move(pos)};
                    }
                    else {
                        return match_t{arg.substr(match.at(), match.length()),
                                       std::move(pos)};
                    }
                }
            }
        }
        ++pos;
    }
    return match_t{};
}